

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Reals __thiscall Omega_h::interpolate_between(Omega_h *this,Reals *a,Reals *b,Real t)

{
  Alloc *pAVar1;
  Alloc *pAVar2;
  ulong uVar3;
  void *extraout_RDX;
  ulong uVar4;
  uint size_in;
  size_t sVar5;
  Reals RVar6;
  Write<double> out;
  type f;
  Write<double> local_100;
  Real local_f0;
  Write<signed_char> local_e8;
  string local_d8;
  Real local_b8;
  Write<signed_char> local_b0;
  Write<double> local_a0;
  Write<double> local_90;
  Real local_80;
  Write<double> local_78;
  Write<double> local_68;
  Write<double> local_58;
  Real local_48;
  Write<double> local_40;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar4 = pAVar1->size;
  }
  else {
    uVar4 = (ulong)pAVar1 >> 3;
  }
  pAVar2 = (b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    uVar3 = pAVar2->size;
  }
  else {
    uVar3 = (ulong)pAVar2 >> 3;
  }
  local_f0 = t;
  if ((int)(uVar4 >> 3) == (int)(uVar3 >> 3)) {
    if (((ulong)pAVar1 & 1) == 0) {
      sVar5 = pAVar1->size;
    }
    else {
      sVar5 = (ulong)pAVar1 >> 3;
    }
    std::__cxx11::string::string((string *)&local_d8,"",(allocator *)&local_a0);
    size_in = (uint)(sVar5 >> 3);
    Write<double>::Write(&local_100,size_in,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    Write<double>::Write(&local_68,&local_100);
    Write<double>::Write(&local_58,&a->write_);
    local_48 = local_f0;
    Write<double>::Write(&local_40,&b->write_);
    Write<double>::Write(&local_a0,&local_68);
    Write<double>::Write(&local_90,&local_58);
    local_80 = local_48;
    Write<double>::Write(&local_78,&local_40);
    if (0 < (int)size_in) {
      entering_parallel = 1;
      Write<double>::Write((Write<signed_char> *)&local_d8,(Write<signed_char> *)&local_a0);
      Write<double>::Write((Write<signed_char> *)&local_d8.field_2,(Write<signed_char> *)&local_90);
      local_b8 = local_80;
      Write<double>::Write(&local_b0,(Write<signed_char> *)&local_78);
      entering_parallel = 0;
      for (uVar4 = 0; (size_in & 0x7fffffff) != uVar4; uVar4 = uVar4 + 1) {
        *(double *)(local_d8._M_string_length + uVar4 * 8) =
             (1.0 - local_b8) * *(double *)(local_d8.field_2._8_8_ + uVar4 * 8) +
             local_b8 * *(double *)((long)local_b0.shared_alloc_.direct_ptr + uVar4 * 8);
      }
      interpolate_between(Omega_h::Read<double>,Omega_h::Read<double>,double)::$_0::~__0
                ((__0 *)&local_d8);
    }
    interpolate_between(Omega_h::Read<double>,Omega_h::Read<double>,double)::$_0::~__0
              ((__0 *)&local_a0);
    Write<double>::Write(&local_e8,(Write<signed_char> *)&local_100);
    Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&local_e8);
    Write<double>::~Write((Write<double> *)&local_e8);
    interpolate_between(Omega_h::Read<double>,Omega_h::Read<double>,double)::$_0::~__0
              ((__0 *)&local_68);
    Write<double>::~Write(&local_100);
    RVar6.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Reals)RVar6.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0x238);
}

Assistant:

Reals interpolate_between(Reals a, Reals b, Real t) {
  OMEGA_H_CHECK(a.size() == b.size());
  auto n = a.size();
  auto out = Write<Real>(n);
  auto f = OMEGA_H_LAMBDA(LO i) { out[i] = a[i] * (1.0 - t) + b[i] * t; };
  parallel_for(n, f, "interpolate_between");
  return out;
}